

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

int cmSourceFileGetPropertyAsBool(void *arg,char *prop)

{
  cmSourceFile *this;
  bool bVar1;
  char *value;
  allocator<char> local_31;
  string local_30;
  
  this = *arg;
  if (this == (cmSourceFile *)0x0) {
    value = cmSourceFileGetProperty(arg,prop);
    bVar1 = cmValue::IsOn(value);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,prop,&local_31);
    bVar1 = cmSourceFile::GetPropertyAsBool(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return (int)bVar1;
}

Assistant:

static int CCONV cmSourceFileGetPropertyAsBool(void* arg, const char* prop)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    return rsf->GetPropertyAsBool(prop) ? 1 : 0;
  }
  return cmIsOn(cmSourceFileGetProperty(arg, prop)) ? 1 : 0;
}